

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.hpp
# Opt level: O2

void __thiscall
BSP<int>::swapVectors
          (BSP<int> *this,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *a,vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_> *b)

{
  pointer pLVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  size_t i;
  ulong uVar5;
  pointer *ppiVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  
  iVar4 = (int)(((long)(a->
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                (long)(a->
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start) / 0x18);
  iVar2 = (int)(((long)(b->
                       super__Vector_base<LockableVector<int>,_std::allocator<LockableVector<int>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                (long)(b->
                      super__Vector_base<LockableVector<int>,_std::allocator<LockableVector<int>_>_>
                      )._M_impl.super__Vector_impl_data._M_start) / 0x70);
  if (iVar2 < iVar4) {
    std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>::resize(b,(long)iVar4);
  }
  else if (iVar4 < iVar2) {
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::resize(a,(long)iVar2);
  }
  lVar7 = 0;
  lVar8 = 0;
  uVar5 = 0;
  while( true ) {
    pLVar1 = (b->super__Vector_base<LockableVector<int>,_std::allocator<LockableVector<int>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar3 = ((long)(b->
                   super__Vector_base<LockableVector<int>,_std::allocator<LockableVector<int>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)pLVar1) / 0x70;
    if (uVar3 <= uVar5) break;
    LockableVector<int>::swap
              ((LockableVector<int> *)
               ((long)&(pLVar1->dataVector).super__Vector_base<int,_std::allocator<int>_>._M_impl +
               lVar7),(vector<int,_std::allocator<int>_> *)
                      ((long)&(((a->
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data + lVar8));
    uVar5 = uVar5 + 1;
    lVar8 = lVar8 + 0x18;
    lVar7 = lVar7 + 0x70;
  }
  ppiVar6 = (pointer *)
            ((long)&(pLVar1->dataVector).super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
  while (bVar9 = uVar3 != 0, uVar3 = uVar3 - 1, bVar9) {
    if (*ppiVar6 != ((_Vector_impl_data *)(ppiVar6 + -1))->_M_start) {
      *ppiVar6 = ((_Vector_impl_data *)(ppiVar6 + -1))->_M_start;
    }
    ppiVar6 = ppiVar6 + 0xe;
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::_M_shrink_to_fit(a);
  return;
}

Assistant:

void BSP<T>::swapVectors (std::vector<std::vector<T>> &a, std::vector<LockableVector<T>> &b) {
	int aSize	= a.size ();
	int bSize	= b.size ();

	// Checking if vectors have different sizes
	if (aSize > bSize) {
		b.resize (aSize);
	}
	else if ( aSize < bSize) {
		a.resize (bSize);
	}

	for (size_t i=0; i< b.size(); i++) {
		b[i].swap (a[i]);
	}

	for (size_t i=0; i< b.size(); i++) {
		b[i].getVector().clear ();
	}

	a.shrink_to_fit ();
	b.shrink_to_fit ();
}